

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

void Nwk_NodeUpdateRequired(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  Nwk_Obj_t *pObj_01;
  int i;
  long lVar3;
  bool bVar4;
  float fVar5;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                  ,0x289,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  p_00 = pObj->pMan->vTemp;
  fVar5 = Nwk_NodeComputeRequired(pObj,1);
  if ((fVar5 + 0.01 <= pObj->tRequired) || (pObj->tRequired + 0.01 <= fVar5)) {
    __assert_fail("Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkTiming.c"
                  ,0x28c,"void Nwk_NodeUpdateRequired(Nwk_Obj_t *)");
  }
  p_00->nSize = 0;
  lVar3 = 0;
  pObj_01 = (Nwk_Obj_t *)0x0;
  do {
    if (pObj->nFanins <= lVar3) {
LAB_00718240:
      if (p != (Tim_Man_t *)0x0) {
        Tim_ManIncrementTravId(p);
      }
      i = 0;
      do {
        if (p_00->nSize <= i) {
          return;
        }
        pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(p_00,i);
        pObj_00->field_0x20 = pObj_00->field_0x20 & 0xef;
        fVar5 = Nwk_NodeComputeRequired(pObj_00,1);
        if ((p != (Tim_Man_t *)0x0) && ((*(uint *)&pObj_00->field_0x20 & 7) == 2)) {
          fVar5 = Tim_ManGetCoRequired(p,*(uint *)&pObj_00->field_0x20 >> 7);
        }
        if ((fVar5 + 0.01 <= pObj_00->tRequired) || (pObj_00->tRequired + 0.01 <= fVar5)) {
          pObj_00->tRequired = fVar5;
          if ((*(uint *)&pObj_00->field_0x20 & 7) == 1) {
            if (p != (Tim_Man_t *)0x0) {
              iVar1 = Tim_ManBoxForCi(p,*(uint *)&pObj_00->field_0x20 >> 7);
              if (-1 < iVar1) {
                iVar2 = Tim_ManIsCiTravIdCurrent(p,*(uint *)&pObj_00->field_0x20 >> 7);
                if (iVar2 != 0) {
                  Tim_ManSetPreviousTravIdBoxOutputs(p,iVar1);
                }
                Tim_ManSetCiRequired(p,*(uint *)&pObj_00->field_0x20 >> 7,fVar5);
                Tim_ManSetCurrentTravIdBoxOutputs(p,iVar1);
                iVar2 = Tim_ManBoxInputFirst(p,iVar1);
                iVar1 = Tim_ManBoxInputNum(p,iVar1);
                if (iVar1 < 1) {
                  iVar1 = 0;
                }
                while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
                  pObj_01 = Nwk_ManCo(pObj_01->pMan,iVar2);
                  if ((pObj_01->field_0x20 & 0x10) == 0) {
                    Nwk_NodeUpdateAddToQueue(p_00,pObj_01,i,0);
                    pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
                  }
                  iVar2 = iVar2 + 1;
                }
              }
            }
          }
          else {
            for (lVar3 = 0; lVar3 < pObj_00->nFanins; lVar3 = lVar3 + 1) {
              pObj_01 = pObj_00->pFanio[lVar3];
              if (pObj_01 == (Nwk_Obj_t *)0x0) {
                pObj_01 = (Nwk_Obj_t *)0x0;
                break;
              }
              if ((pObj_01->field_0x20 & 0x10) == 0) {
                Nwk_NodeUpdateAddToQueue(p_00,pObj_01,i,0);
                pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
              }
            }
          }
        }
        i = i + 1;
      } while( true );
    }
    pObj_01 = pObj->pFanio[lVar3];
    if (pObj_01 == (Nwk_Obj_t *)0x0) {
      pObj_01 = (Nwk_Obj_t *)0x0;
      goto LAB_00718240;
    }
    if ((pObj_01->field_0x20 & 0x10) == 0) {
      Nwk_NodeUpdateAddToQueue(p_00,pObj_01,-1,0);
      pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void Nwk_NodeUpdateRequired( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    float tRequired;
    int iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // make sure the node's required time remained the same
    tRequired = Nwk_NodeComputeRequired( pObj, 1 );
    assert( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 ) );
    // initialize the queue with the node's faninsa and the old node's fanins
    Vec_PtrClear( vQueue );
    Nwk_ObjForEachFanin( pObj, pNext, k )
    {
        if ( pNext->MarkA )
            continue;
        Nwk_NodeUpdateAddToQueue( vQueue, pNext, -1, 0 );
        pNext->MarkA = 1;
    }
    // process objects
    if ( pManTime )
        Tim_ManIncrementTravId( pManTime );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        tRequired = Nwk_NodeComputeRequired( pTemp, 1 );
        if ( Nwk_ObjIsCo(pTemp) && pManTime )
            tRequired = Tim_ManGetCoRequired( pManTime, pTemp->PioId );
        if ( Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pTemp), (float)0.01 ) )
            continue;
        Nwk_ObjSetRequired( pTemp, tRequired );
        // add the fanins to the queue
        if ( Nwk_ObjIsCi(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCi( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this CI is an output of the box
                {
                    // it may happen that a box-output (CI) was already marked as visited
                    // when some other box-output of the same box was visited - here we undo this
                    if ( Tim_ManIsCiTravIdCurrent( pManTime, pTemp->PioId ) )
                        Tim_ManSetPreviousTravIdBoxOutputs( pManTime, iBox );
                    Tim_ManSetCiRequired( pManTime, pTemp->PioId, tRequired );
                    Tim_ManSetCurrentTravIdBoxOutputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCo(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanin( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 0 );
                pNext->MarkA = 1;
            }
        }
    }
}